

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O2

REF_STATUS ref_agents_population(REF_AGENTS ref_agents,char *context)

{
  int *piVar1;
  REF_MPI ref_mpi;
  uint uVar2;
  void *value;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  ref_mpi = ref_agents->ref_mpi;
  value = malloc(0x20);
  if (value == (void *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0x62,
           "ref_agents_population","malloc counts of REF_INT NULL");
    uVar2 = 2;
  }
  else {
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      *(undefined4 *)((long)value + lVar3 * 4) = 0;
    }
    uVar4 = 0;
    uVar6 = (ulong)(uint)ref_agents->max;
    if (ref_agents->max < 1) {
      uVar6 = uVar4;
    }
    for (; uVar6 * 0x68 - uVar4 != 0; uVar4 = uVar4 + 0x68) {
      uVar5 = (ulong)*(uint *)((long)ref_agents->agent->xyz + (uVar4 - 0x30));
      if (7 < uVar5) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",
               0x65,"ref_agents_population","last");
        return 1;
      }
      piVar1 = (int *)((long)value + uVar5 * 4);
      *piVar1 = *piVar1 + 1;
    }
    uVar2 = ref_mpi_allsum(ref_mpi,value,8,1);
    if (uVar2 == 0) {
      if (ref_mpi->id == 0) {
        uVar6 = 0;
        for (lVar3 = 1; lVar3 != 8; lVar3 = lVar3 + 1) {
          uVar6 = (ulong)(uint)((int)uVar6 + *(int *)((long)value + lVar3 * 4));
        }
        printf(" %5d of",uVar6);
        for (uVar6 = 1; uVar6 != 8; uVar6 = uVar6 + 1) {
          printf(" %d:%4d",uVar6 & 0xffffffff,(ulong)*(uint *)((long)value + uVar6 * 4));
        }
        printf(" %s\n",context);
      }
      free(value);
      uVar2 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0x68
             ,"ref_agents_population",(ulong)uVar2,"as");
    }
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_agents_population(REF_AGENTS ref_agents,
                                         const char *context) {
  REF_MPI ref_mpi = ref_agents->ref_mpi;
  REF_INT id, *counts;
  ref_malloc_init(counts, REF_AGENT_MODE_LAST, REF_INT, 0);
  for (id = 0; id < ref_agents->max; id++) {
    RAS(0 <= ref_agent_mode(ref_agents, id), "last");
    RAS(REF_AGENT_MODE_LAST > ref_agent_mode(ref_agents, id), "last");
    counts[ref_agent_mode(ref_agents, id)]++;
  }
  RSS(ref_mpi_allsum(ref_mpi, counts, REF_AGENT_MODE_LAST, REF_INT_TYPE), "as");
  if (ref_mpi_once(ref_mpi)) {
    REF_INT total = 0;
    for (id = 1; id < REF_AGENT_MODE_LAST; id++) total += counts[id];
    printf(" %5d of", total);
    for (id = 1; id < REF_AGENT_MODE_LAST; id++)
      printf(" %d:%4d", id, counts[id]);
    printf(" %s\n", context);
  }
  ref_free(counts);
  return REF_SUCCESS;
}